

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

bool __thiscall QMakeProperty::hasValue(QMakeProperty *this,ProKey *v)

{
  long in_FS_OFFSET;
  ProString PStack_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  value(&PStack_48,this,v);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return PStack_48.m_string.d.ptr != (char16_t *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool
QMakeProperty::hasValue(const ProKey &v)
{
    return !value(v).isNull();
}